

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  byte bVar1;
  ushort uVar2;
  Btree *pBtree;
  BtShared *pBVar3;
  long lVar4;
  long lVar5;
  Pgno parent;
  BtreePayload *pBVar6;
  BtCursor *pCur_00;
  int iVar7;
  Pgno PVar8;
  void *pvVar9;
  Pgno PVar10;
  ulong uVar11;
  uint *puVar12;
  void *pvVar13;
  u64 v;
  void *pvVar14;
  int iVar15;
  ulong uVar16;
  MemPage *pMVar17;
  uint uVar18;
  size_t __n;
  u8 *__s;
  int local_a4;
  int loc;
  Pgno local_9c;
  uint local_98;
  int local_94;
  uint *local_90;
  BtreePayload *local_88;
  MemPage *local_80;
  void *local_78;
  int rc;
  ulong local_68;
  uint *local_60;
  MemPage *local_58;
  MemPage *pOvfl;
  Mem *local_48;
  u16 local_40;
  undefined2 uStack_3e;
  ushort uStack_3c;
  ushort local_3a;
  BtCursor *local_38;
  
  if (pCur->eState == '\x04') {
    return pCur->skipNext;
  }
  pBtree = pCur->pBtree;
  pBVar3 = pBtree->pBt;
  loc = seekResult;
  local_88 = pX;
  if (((pCur->curFlags & 0x20) != 0) &&
     (local_a4 = saveAllCursors(pBVar3,pCur->pgnoRoot,pCur), local_a4 != 0)) {
    return local_a4;
  }
  pBVar6 = local_88;
  pOvfl = (MemPage *)pCur->pKeyInfo;
  local_94 = flags;
  if (pOvfl != (MemPage *)0x0) {
    if ((flags & 2U) == 0 && seekResult == 0) {
      if (local_88->nMem == 0) {
        local_a4 = btreeMoveto(pCur,local_88->pKey,local_88->nKey,(uint)(flags != 0),&loc);
      }
      else {
        local_48 = local_88->aMem;
        uStack_3e._0_1_ = '\0';
        uStack_3e._1_1_ = '\0';
        uStack_3c = 0;
        local_3a = local_3a & 0xff00;
        local_40 = local_88->nMem;
        local_a4 = sqlite3BtreeMovetoUnpacked
                             (pCur,(UnpackedRecord *)&pOvfl,0,(uint)(flags != 0),&loc);
      }
      if (local_a4 != 0) {
        return local_a4;
      }
    }
    goto LAB_00130cba;
  }
  invalidateIncrblobCursors(pBtree,local_88->nKey,0);
  if ((pCur->curFlags & 2) != 0) {
    lVar4 = pBVar6->nKey;
    lVar5 = (pCur->info).nKey;
    if (lVar4 == lVar5) {
      loc = 0;
      goto LAB_00130cba;
    }
    if (lVar5 == lVar4 + -1 && 0 < lVar4) {
      loc = -1;
      goto LAB_00130cba;
    }
  }
  if (seekResult == 0) {
    iVar7 = sqlite3BtreeMovetoUnpacked
                      (pCur,(UnpackedRecord *)0x0,local_88->nKey,(uint)(local_94 != 0),&loc);
    if (iVar7 != 0) {
      return iVar7;
    }
    local_a4 = 0;
  }
LAB_00130cba:
  pBVar6 = local_88;
  pMVar17 = pCur->apPage[pCur->iPage];
  puVar12 = (uint *)pBVar3->pTmpSpace;
  pOvfl = (MemPage *)0x0;
  pBVar3 = pMVar17->pBt;
  local_9c = 0;
  bVar1 = pMVar17->childPtrSize;
  uVar11 = (ulong)bVar1;
  local_90 = puVar12;
  local_80 = pMVar17;
  local_38 = pCur;
  if (pMVar17->intKey == '\0') {
    pvVar9 = local_88->pKey;
    uVar16 = local_88->nKey;
    if ((uint)uVar16 < 0x80) {
      *(u8 *)((long)puVar12 + uVar11) = (u8)uVar16;
      uVar18 = 1;
    }
    else {
      uVar18 = sqlite3PutVarint((uchar *)((long)puVar12 + uVar11),(long)(int)(uint)uVar16);
      uVar18 = uVar18 & 0xff;
    }
    iVar7 = uVar18 + bVar1;
    v = uVar16 & 0xffffffff;
    puVar12 = local_90;
  }
  else {
    local_68 = (ulong)local_88->nData;
    v = (long)local_88->nZero + local_68;
    local_78 = local_88->pData;
    if ((uint)v < 0x80) {
      uVar18 = 1;
      *(u8 *)((long)puVar12 + uVar11) = (u8)v;
    }
    else {
      uVar18 = sqlite3PutVarint((uchar *)(uVar11 + (long)puVar12),v);
      uVar18 = uVar18 & 0xff;
    }
    uVar18 = uVar18 + bVar1;
    iVar7 = sqlite3PutVarint((uchar *)((ulong)uVar18 + (long)puVar12),pBVar6->nKey);
    iVar7 = iVar7 + uVar18;
    pvVar9 = local_78;
    uVar16 = local_68;
    pMVar17 = local_80;
  }
  iVar15 = (int)v;
  if ((int)(uint)pMVar17->maxLocal < iVar15) {
    uVar2 = pMVar17->minLocal;
    uVar18 = (iVar15 - (uint)uVar2) % (pMVar17->pBt->usableSize - 4) + (uint)uVar2;
    if ((int)(uint)pMVar17->maxLocal < (int)uVar18) {
      uVar18 = (uint)uVar2;
    }
    pvVar14 = (void *)(ulong)uVar18;
    local_98 = uVar18 + iVar7 + 4;
    local_60 = (uint *)((long)(int)(uVar18 + iVar7) + (long)puVar12);
  }
  else {
    local_98 = iVar15 + iVar7;
    if ((int)local_98 < 5) {
      local_98 = 4;
    }
    pvVar14 = (void *)(v & 0xffffffff);
    local_60 = puVar12;
  }
  __s = (u8 *)((long)iVar7 + (long)puVar12);
  local_58 = (MemPage *)0x0;
  do {
    parent = local_9c;
    iVar7 = sqlite3PendingByte;
    if ((int)v < 1) {
      iVar7 = 0;
LAB_00130faa:
      releasePage(local_58);
      pCur_00 = local_38;
      pMVar17 = local_80;
      if (iVar7 != 0) {
        return iVar7;
      }
      uVar2 = local_38->aiIdx[local_38->iPage];
      uVar18 = (uint)uVar2;
      if (loc == 0) {
        local_a4 = iVar7;
        iVar7 = sqlite3PagerWrite(local_80->pDbPage);
        if (iVar7 != 0) {
          return iVar7;
        }
        puVar12 = (uint *)(pMVar17->aData +
                          (CONCAT11(pMVar17->aCellIdx[(ulong)uVar2 * 2],
                                    pMVar17->aCellIdx[(ulong)uVar2 * 2 + 1]) & pMVar17->maskPage));
        if (pMVar17->leaf == '\0') {
          *local_90 = *puVar12;
        }
        local_a4 = clearCell(pMVar17,(uchar *)puVar12,(CellInfo *)&pOvfl);
        pMVar17 = local_80;
        if ((local_98 == local_3a) && (CONCAT22(uStack_3e,local_40) == (uint)uStack_3c)) {
          if (local_80->aDataEnd < (u8 *)((long)puVar12 + (ulong)local_98)) {
            iVar7 = sqlite3CorruptError(0x1058f);
            return iVar7;
          }
          memcpy(puVar12,local_90,(ulong)local_98);
          return 0;
        }
        dropCell(local_80,(uint)uVar2,(uint)local_3a,&local_a4);
        if (local_a4 != 0) {
          return local_a4;
        }
      }
      else {
        local_a4 = 0;
        if ((loc < 0) && (local_80->nCell != 0)) {
          local_38->aiIdx[local_38->iPage] = uVar2 + 1;
          uVar18 = (uint)(ushort)(uVar2 + 1);
        }
      }
      insertCell(pMVar17,uVar18,(u8 *)local_90,local_98,(u8 *)0x0,0,&local_a4);
      (pCur_00->info).nSize = 0;
      iVar7 = local_a4;
      if (pMVar17->nOverflow != '\0') {
        pCur_00->curFlags = pCur_00->curFlags & 0xfd;
        iVar7 = balance(pCur_00);
        pCur_00->apPage[pCur_00->iPage]->nOverflow = '\0';
        pCur_00->eState = '\0';
        if ((iVar7 == 0 & (byte)local_94 >> 1) == 1) {
          iVar7 = moveToRoot(pCur_00);
          pBVar6 = local_88;
          if (pCur_00->pKeyInfo != (KeyInfo *)0x0) {
            pvVar9 = sqlite3Malloc(local_88->nKey);
            pCur_00->pKey = pvVar9;
            if (pvVar9 == (void *)0x0) {
              iVar7 = 7;
            }
            else {
              memcpy(pvVar9,pBVar6->pKey,pBVar6->nKey);
            }
          }
          pCur_00->eState = '\x03';
          pCur_00->nKey = pBVar6->nKey;
        }
      }
      return iVar7;
    }
    local_68 = v;
    if ((int)pvVar14 == 0) {
      PVar10 = local_9c;
      local_78 = pvVar9;
      if (pBVar3->autoVacuum != '\0') {
        do {
          do {
            uVar18 = PVar10;
            PVar10 = uVar18 + 1;
            PVar8 = ptrmapPageno(pBVar3,PVar10);
          } while (PVar10 == PVar8);
        } while (uVar18 == (uint)iVar7 / pBVar3->pageSize);
        local_9c = uVar18 + 1;
      }
      iVar7 = allocateBtreePage(pBVar3,&pOvfl,&local_9c,local_9c,'\0');
      PVar10 = local_9c;
      rc = iVar7;
      if ((pBVar3->autoVacuum == '\0') || (iVar7 != 0)) {
        if (iVar7 != 0) goto LAB_00130faa;
      }
      else {
        ptrmapPut(pBVar3,local_9c,'\x04' - (parent == 0),parent,&rc);
        iVar7 = rc;
        if (rc != 0) {
          releasePage(pOvfl);
          goto LAB_00130faa;
        }
      }
      *local_60 = PVar10 >> 0x18 | (PVar10 & 0xff0000) >> 8 | (PVar10 & 0xff00) << 8 |
                  PVar10 << 0x18;
      releasePage(local_58);
      local_60 = (uint *)pOvfl->aData;
      *local_60 = 0;
      local_58 = pOvfl;
      __s = pOvfl->aData + 4;
      pvVar14 = (void *)(ulong)(pBVar3->usableSize - 4);
      pvVar9 = local_78;
    }
    pvVar13 = pvVar14;
    if ((int)local_68 < (int)pvVar14) {
      pvVar13 = (void *)(local_68 & 0xffffffff);
    }
    iVar15 = (int)uVar16;
    iVar7 = (int)pvVar13;
    local_78 = pvVar14;
    if (iVar15 < 1) {
      __n = (size_t)iVar7;
      memset(__s,0,__n);
    }
    else {
      if (iVar15 <= iVar7) {
        iVar7 = iVar15;
      }
      __n = (size_t)iVar7;
      memcpy(__s,pvVar9,__n);
    }
    v = (u64)(uint)((int)local_68 - iVar7);
    __s = __s + __n;
    pvVar9 = (void *)((long)pvVar9 + __n);
    uVar16 = (ulong)(uint)(iVar15 - iVar7);
    pvVar14 = (void *)(ulong)(uint)((int)local_78 - iVar7);
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior MovetoUnpacked() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND))==flags );

  if( pCur->eState==CURSOR_FAULT ){
    assert( pCur->skipNext!=SQLITE_OK );
    return pCur->skipNext;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (pX->pKey==0)==(pCur->pKeyInfo==0) );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the 
  ** integer key to use. It then calls this function to actually insert the 
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob 
    ** cursors open on the row being replaced */
    invalidateIncrblobCursors(p, pX->nKey, 0);

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.  */
    assert( (flags & BTREE_SAVEPOSITION)==0 || 
            ((pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey) );

    /* If the cursor is currently on the last row and we are appending a
    ** new row onto the end, set the "loc" to avoid an unnecessary
    ** btreeMoveto() call */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      loc = 0;
    }else if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey>0
               && pCur->info.nKey==pX->nKey-1 ){
      loc = -1;
    }else if( loc==0 ){
      rc = sqlite3BtreeMovetoUnpacked(pCur, 0, pX->nKey, flags!=0, &loc);
      if( rc ) return rc;
    }
  }else if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
    if( pX->nMem ){
      UnpackedRecord r;
      r.pKeyInfo = pCur->pKeyInfo;
      r.aMem = pX->aMem;
      r.nField = pX->nMem;
      r.default_rc = 0;
      r.errCode = 0;
      r.r1 = 0;
      r.r2 = 0;
      r.eqSeen = 0;
      rc = sqlite3BtreeMovetoUnpacked(pCur, &r, 0, flags!=0, &loc);
    }else{
      rc = btreeMoveto(pCur, pX->pKey, pX->nKey, flags!=0, &loc);
    }
    if( rc ) return rc;
  }
  assert( pCur->eState==CURSOR_VALID || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->intKey || pX->nKey>=0 );
  assert( pPage->leaf || !pPage->intKey );

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  rc = fillInCell(pPage, newCell, pX, &szNew);
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->aiIdx[pCur->iPage];
  if( loc==0 ){
    CellInfo info;
    assert( idx<pPage->nCell );
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    rc = clearCell(pPage, oldCell, &info);
    if( info.nSize==szNew && info.nLocal==info.nPayload ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell(). */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell+szNew > pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->aiIdx[pCur->iPage];
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance() 
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise. 
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->apPage[pCur->iPage]->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      rc = moveToRoot(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->apPage[pCur->iPage]->nOverflow==0 );

end_insert:
  return rc;
}